

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoffInterface.h
# Opt level: O0

void __thiscall
BayesianGameIdenticalPayoffInterface::Print(BayesianGameIdenticalPayoffInterface *this)

{
  long *in_RDI;
  string local_28 [40];
  
  (**(code **)(*in_RDI + 0x90))();
  std::operator<<((ostream *)&std::cout,local_28);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

virtual void Print() const
        { std::cout << SoftPrint();}